

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeSet::setPattern(UnicodeSet *this,UnicodeString *newPat)

{
  int32_t iVar1;
  char16_t *pcVar2;
  int32_t newPatLen;
  UnicodeString *newPat_local;
  UnicodeSet *this_local;
  
  releasePattern(this);
  iVar1 = icu_63::UnicodeString::length(newPat);
  pcVar2 = (char16_t *)uprv_malloc_63((long)(iVar1 + 1) << 1);
  this->pat = pcVar2;
  if (this->pat != (char16_t *)0x0) {
    this->patLen = iVar1;
    icu_63::UnicodeString::extractBetween(newPat,0,this->patLen,this->pat,0);
    this->pat[this->patLen] = L'\0';
  }
  return;
}

Assistant:

void UnicodeSet::setPattern(const UnicodeString& newPat) {
    releasePattern();
    int32_t newPatLen = newPat.length();
    pat = (UChar *)uprv_malloc((newPatLen + 1) * sizeof(UChar));
    if (pat) {
        patLen = newPatLen;
        newPat.extractBetween(0, patLen, pat);
        pat[patLen] = 0;
    }
    // else we don't care if malloc failed. This was just a nice cache.
    // We can regenerate an equivalent pattern later when requested.
}